

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pdf_unicode.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  char ***pppcVar3;
  QPDFObjectHandle str;
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  string local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  char **local_48 [3];
  
  __s = *argv;
  pcVar1 = strrchr(__s,0x2f);
  whoami = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    whoami = __s;
  }
  if (argc == 2) {
    QUtil::read_lines_from_file_abi_cxx11_((char *)local_48,SUB81(argv[1],0));
    if ((char ***)local_48[0] != local_48) {
      pppcVar3 = (char ***)local_48[0];
      do {
        QPDFObjectHandle::newUnicodeString(local_58);
        QPDFObjectHandle::getUTF8Value_abi_cxx11_();
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_78,local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," // ",4);
        QPDFObjectHandle::unparseBinary_abi_cxx11_();
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_98,local_90);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        pppcVar3 = (char ***)*pppcVar3;
      } while (pppcVar3 != local_48);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_48);
    return 0;
  }
  usage();
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if (argc != 2) {
        usage();
    }
    char const* infilename = argv[1];
    for (auto const& line: QUtil::read_lines_from_file(infilename)) {
        QPDFObjectHandle str = QPDFObjectHandle::newUnicodeString(line);
        std::cout << str.getUTF8Value() << " // " << str.unparseBinary() << std::endl;
    }
    return 0;
}